

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O3

bool __thiscall
HighsCutGeneration::cmirCutGenerationHeuristic
          (HighsCutGeneration *this,double minEfficacy,bool onlyInitialCMIRScale)

{
  vector<double,_std::allocator<double>_> *this_00;
  int iVar1;
  pointer pdVar2;
  pointer piVar3;
  iterator __position;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  int *piVar4;
  int *piVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var13;
  int *piVar14;
  int *piVar15;
  double *pdVar16;
  ulong uVar17;
  ulong uVar18;
  HighsCDouble *__args;
  int iVar19;
  iterator iVar20;
  long lVar21;
  uint uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  HighsCDouble HVar35;
  double delta;
  double local_d0;
  ulong uStack_b0;
  undefined1 local_a8 [16];
  HighsCDouble local_98;
  undefined1 local_88 [16];
  double local_78;
  undefined8 uStack_70;
  HighsCDouble local_68;
  HighsCDouble local_58;
  undefined1 local_48 [16];
  
  auVar7._8_4_ = in_XMM0_Dc;
  auVar7._0_8_ = minEfficacy;
  auVar7._12_4_ = in_XMM0_Dd;
  this->integralSupport = false;
  this->integralCoefficients = false;
  this_00 = &this->deltas;
  pdVar2 = (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  std::vector<double,_std::allocator<double>_>::reserve(this_00,(long)this->rowlen + 3);
  piVar3 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar3) {
    (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar3;
  }
  std::vector<int,_std::allocator<int>_>::reserve(&this->integerinds,(long)this->rowlen);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->complementation,(long)this->rowlen);
  local_68.hi = (double)((ulong)local_68.hi._4_4_ << 0x20);
  if (this->rowlen == 0) {
    local_a8._0_8_ = 0.0;
    local_d0 = 0.0;
    uVar33 = 0;
    uVar34 = 0;
  }
  else {
    iVar19 = 0;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_a8._0_8_;
    local_a8 = auVar12 << 0x40;
    local_d0 = 0.0;
    uVar33 = 0;
    uVar34 = 0;
    do {
      if ((this->isintegral).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[iVar19] == '\0') {
        dVar31 = this->vals[iVar19];
        dVar28 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar19];
        local_a8._0_8_ = (double)local_a8._0_8_ + dVar31 * dVar28;
        if (((dVar31 <= 0.0) || (this->feastol < dVar28)) &&
           ((0.0 <= dVar31 ||
            (dVar28 < (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar19] - this->feastol)))) {
          local_d0 = local_d0 + dVar31 * dVar31;
        }
      }
      else {
        __position._M_current =
             (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->integerinds,__position,
                     (int *)&local_68);
        }
        else {
          *__position._M_current = iVar19;
          (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        dVar31 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[local_68.hi._0_4_];
        dVar31 = dVar31 + dVar31;
        pdVar16 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + local_68.hi._0_4_;
        iVar19 = local_68.hi._0_4_;
        if (*pdVar16 <= dVar31 && dVar31 != *pdVar16) {
          flipComplementation(this,local_68.hi._0_4_);
          iVar19 = local_68.hi._0_4_;
        }
        if ((!onlyInitialCMIRScale) &&
           (dVar31 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar19],
           this->feastol <= dVar31 && dVar31 != this->feastol)) {
          local_98.hi = ABS(this->vals[iVar19]);
          if (local_98.hi <= 0.0001) {
LAB_0027e181:
            dVar31 = (double)CONCAT44(uVar34,uVar33);
          }
          else {
            if ((local_98.hi == (double)CONCAT44(uVar34,uVar33)) &&
               (!NAN(local_98.hi) && !NAN((double)CONCAT44(uVar34,uVar33)))) goto LAB_0027e181;
            dVar31 = local_98.hi;
            if (local_98.hi <= (double)CONCAT44(uVar34,uVar33)) {
              dVar31 = (double)CONCAT44(uVar34,uVar33);
            }
            iVar20._M_current =
                 (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar20._M_current ==
                (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)this_00,iVar20,&local_98.hi);
              iVar19 = local_68.hi._0_4_;
            }
            else {
              *iVar20._M_current = local_98.hi;
              (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar20._M_current + 1;
            }
          }
          uVar33 = SUB84(dVar31,0);
          uVar34 = (undefined4)((ulong)dVar31 >> 0x20);
        }
      }
      iVar19 = iVar19 + 1;
      local_68.hi = (double)CONCAT44(local_68.hi._4_4_,iVar19);
    } while (iVar19 != this->rowlen);
    if ((local_d0 != 0.0) || (NAN(local_d0))) goto LAB_0027e2e3;
  }
  pdVar16 = (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar17 = (long)(this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pdVar16;
  if (8 < uVar17) {
    local_98.hi = HighsIntegers::integralScale(pdVar16,(HighsInt)(uVar17 >> 3),this->feastol,1e-14);
    if (((local_98.hi != 0.0) || (NAN(local_98.hi))) && (local_98.hi <= 10000.0)) {
      dVar31 = ((this->rhs).hi + (this->rhs).lo) * local_98.hi;
      dVar31 = dVar31 - (double)(long)((long)dVar31 - (ulong)(dVar31 < (double)(long)dVar31));
      if ((0.005 <= dVar31) && (dVar31 <= 0.995)) {
        local_98.hi = 1.0 / local_98.hi;
        iVar20._M_current =
             (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar20._M_current ==
            (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (this_00,iVar20,&local_98.hi);
        }
        else {
          *iVar20._M_current = local_98.hi;
          (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar20._M_current + 1;
        }
      }
    }
  }
LAB_0027e2e3:
  local_98.hi = 1.0;
  __args = (HighsCDouble *)&this->initialScale;
  if (1.0 < this->initialScale || this->initialScale == 1.0) {
    __args = &local_98;
  }
  iVar20._M_current =
       (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar20._M_current ==
      (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)this_00,iVar20,&__args->hi);
    iVar20._M_current =
         (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar20._M_current = __args->hi;
    iVar20._M_current = iVar20._M_current + 1;
    (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar20._M_current;
  }
  if (!onlyInitialCMIRScale) {
    dVar31 = this->initialScale;
    uVar23 = SUB84(dVar31,0);
    uVar24 = (undefined4)((ulong)dVar31 >> 0x20);
    if (1.0 <= dVar31) {
      uVar23 = 0;
      uVar24 = 0x3ff00000;
    }
    local_98.hi = (double)CONCAT44(uVar34,uVar33) + (double)CONCAT44(uVar24,uVar23);
    if (iVar20._M_current ==
        (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (this_00,iVar20,&local_98.hi);
      iVar20._M_current =
           (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      *iVar20._M_current = local_98.hi;
      iVar20._M_current = iVar20._M_current + 1;
      (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar20._M_current;
    }
  }
  pdVar16 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar19 = 0;
  if (pdVar16 != iVar20._M_current) {
    uVar17 = (long)iVar20._M_current - (long)pdVar16 >> 3;
    if (1 < uVar17) {
      iVar19 = 0;
      do {
        uVar17 = (long)uVar17 >> 1;
        iVar19 = iVar19 + 1;
      } while (1 < uVar17);
    }
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::less<double>,true>
              (pdVar16,iVar20._M_current,iVar19,1);
    _Var13._M_current =
         (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    uVar17 = (long)__last._M_current - (long)_Var13._M_current >> 3;
    if (1 < uVar17) {
      dVar31 = *_Var13._M_current;
      uVar18 = 1;
      do {
        dVar28 = _Var13._M_current[uVar18];
        uVar33 = SUB84(dVar28,0);
        uVar34 = (undefined4)((ulong)dVar28 >> 0x20);
        if (dVar28 - dVar31 <= this->feastol * 10.0) {
          _Var13._M_current[uVar18] = 0.0;
          uVar33 = SUB84(dVar31,0);
          uVar34 = (undefined4)((ulong)dVar31 >> 0x20);
        }
        uVar18 = uVar18 + 1;
        dVar31 = (double)CONCAT44(uVar34,uVar33);
      } while (uVar17 != uVar18);
    }
    local_98.hi = 0.0;
    _Var13 = std::
             __remove_if<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_equals_val<double_const>>
                       (_Var13,__last,(_Iter_equals_val<const_double>)&local_98);
    pdVar16 = (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (_Var13._M_current !=
        (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = _Var13._M_current;
    }
    uStack_b0 = auVar7._8_8_;
    if (pdVar16 != _Var13._M_current) {
      dVar31 = -1.0;
      uVar17 = 0;
      do {
        dVar28 = *pdVar16;
        dVar25 = 1.0 / dVar28;
        dVar32 = ((this->rhs).hi + (this->rhs).lo) * dVar25;
        dVar26 = (double)(long)((long)dVar32 - (ulong)(dVar32 < (double)(long)dVar32));
        dVar32 = dVar32 - dVar26;
        if (((0.005 <= dVar32) && (dVar32 <= 0.995)) &&
           (dVar9 = 1.0 / (1.0 - dVar32), dVar9 <= 1000000.0)) {
          dVar8 = dVar25 * dVar25 * local_d0;
          dVar26 = (double)local_a8._0_8_ * dVar25 * dVar9 - dVar26;
          piVar14 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar4 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (piVar14 != piVar4) {
            do {
              iVar19 = *piVar14;
              dVar9 = this->vals[iVar19] * dVar25;
              dVar27 = dVar9 + 1e-14;
              lVar21 = (long)dVar27;
              dVar27 = (double)(long)(lVar21 - (ulong)(dVar27 < (double)lVar21));
              dVar9 = (dVar9 - dVar27) - dVar32;
              if (dVar9 <= 0.0) {
                dVar9 = 0.0;
              }
              dVar9 = dVar9 + dVar27;
              dVar27 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar19];
              if (((dVar9 <= 0.0) || (this->feastol < dVar27)) &&
                 ((0.0 <= dVar9 ||
                  (dVar27 < (this->upper).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[iVar19] - this->feastol)))) {
                dVar8 = dVar8 + dVar9 * dVar9;
              }
              dVar26 = dVar26 + dVar9 * dVar27;
              piVar14 = piVar14 + 1;
            } while (piVar14 != piVar4);
          }
          if (dVar8 < 0.0) {
            local_88._8_8_ = 0;
            local_88._0_8_ = dVar28;
            local_78 = dVar26;
            dVar8 = sqrt(dVar8);
            dVar26 = local_78;
            uVar33 = local_88._0_4_;
            uVar34 = local_88._4_4_;
            uVar23 = local_88._8_4_;
            uVar24 = local_88._12_4_;
          }
          else {
            dVar8 = SQRT(dVar8);
            uVar33 = SUB84(dVar28,0);
            uVar34 = (int)((ulong)dVar28 >> 0x20);
            uVar23 = 0;
            uVar24 = 0;
          }
          dVar26 = dVar26 / dVar8;
          dVar28 = dVar26;
          if (dVar26 <= minEfficacy) {
            dVar28 = minEfficacy;
          }
          uVar18 = CONCAT44(uVar24,uVar23) & uStack_b0;
          auVar29._0_8_ = ~-(ulong)(minEfficacy < dVar26) & (ulong)dVar31;
          auVar29._8_8_ = ~uStack_b0 & uVar17;
          auVar10._8_4_ = (int)uVar18;
          auVar10._0_8_ = CONCAT44(uVar34,uVar33) & -(ulong)(minEfficacy < dVar26);
          auVar10._12_4_ = (int)(uVar18 >> 0x20);
          dVar31 = SUB168(auVar29 | auVar10,0);
          uVar17 = SUB168(auVar29 | auVar10,8);
          uStack_b0 = 0;
          minEfficacy = dVar28;
        }
        pdVar16 = pdVar16 + 1;
      } while (pdVar16 != _Var13._M_current);
      if ((dVar31 != -1.0) || (NAN(dVar31))) {
        if (!onlyInitialCMIRScale) {
          uVar22 = 1;
          do {
            uVar33 = 0;
            uVar34 = 0;
            dVar26 = (double)(1 << ((byte)uVar22 & 0x1f)) * dVar31;
            dVar25 = 1.0 / dVar26;
            dVar28 = ((this->rhs).hi + (this->rhs).lo) * dVar25;
            dVar32 = (double)(long)((long)dVar28 - (ulong)(dVar28 < (double)(long)dVar28));
            dVar28 = dVar28 - dVar32;
            if (((0.005 <= dVar28) && (dVar28 <= 0.995)) &&
               (dVar9 = 1.0 / (1.0 - dVar28), dVar9 <= 1000000.0)) {
              dVar8 = dVar25 * dVar25 * local_d0;
              dVar32 = (double)local_a8._0_8_ * dVar25 * dVar9 - dVar32;
              piVar14 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              piVar4 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              if (piVar14 != piVar4) {
                do {
                  iVar19 = *piVar14;
                  dVar9 = this->vals[iVar19] * dVar25;
                  dVar27 = dVar9 + 1e-14;
                  lVar21 = (long)dVar27;
                  dVar27 = (double)(long)(lVar21 - (ulong)(dVar27 < (double)lVar21));
                  dVar9 = (dVar9 - dVar27) - dVar28;
                  if (dVar9 <= 0.0) {
                    dVar9 = 0.0;
                  }
                  dVar9 = dVar9 + dVar27;
                  dVar27 = (this->solval).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[iVar19];
                  if (((dVar9 <= 0.0) || (this->feastol < dVar27)) &&
                     ((0.0 <= dVar9 ||
                      (dVar27 < (this->upper).super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[iVar19] - this->feastol))))
                  {
                    dVar8 = dVar8 + dVar9 * dVar9;
                  }
                  dVar32 = dVar32 + dVar9 * dVar27;
                  piVar14 = piVar14 + 1;
                } while (piVar14 != piVar4);
              }
              if (dVar8 < 0.0) {
                local_88._8_8_ = 0;
                local_88._0_8_ = dVar26;
                local_78 = dVar32;
                dVar8 = sqrt(dVar8);
                dVar26 = local_88._0_8_;
                uVar33 = local_88._8_4_;
                uVar34 = local_88._12_4_;
                dVar32 = local_78;
              }
              else {
                dVar8 = SQRT(dVar8);
              }
              dVar32 = dVar32 / dVar8;
              dVar28 = dVar32;
              if (dVar32 <= minEfficacy) {
                dVar28 = minEfficacy;
              }
              uVar18 = CONCAT44(uVar34,uVar33) & uStack_b0;
              auVar30._0_8_ = ~-(ulong)(minEfficacy < dVar32) & (ulong)dVar31;
              auVar30._8_8_ = ~uStack_b0 & uVar17;
              auVar11._8_4_ = (int)uVar18;
              auVar11._0_8_ = (ulong)dVar26 & -(ulong)(minEfficacy < dVar32);
              auVar11._12_4_ = (int)(uVar18 >> 0x20);
              dVar31 = SUB168(auVar30 | auVar11,0);
              uVar17 = SUB168(auVar30 | auVar11,8);
              uStack_b0 = 0;
              minEfficacy = dVar28;
            }
            bVar6 = uVar22 < 3;
            uVar22 = uVar22 + 1;
          } while (bVar6);
        }
        piVar14 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar4 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (piVar14 != piVar4) {
          dVar28 = 1.0 / dVar31;
          local_d0 = local_d0 * dVar28 * dVar28;
          local_88._0_8_ = dVar28;
          do {
            iVar19 = *piVar14;
            dVar32 = minEfficacy;
            if (((this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar19] < INFINITY) &&
               (this->feastol <
                (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar19])) {
              flipComplementation(this,iVar19);
              dVar32 = ((this->rhs).hi + (this->rhs).lo) * (double)local_88._0_8_;
              dVar26 = (double)(long)((long)dVar32 - (ulong)(dVar32 < (double)(long)dVar32));
              dVar32 = dVar32 - dVar26;
              if ((0.005 <= dVar32) &&
                 ((dVar32 <= 0.995 && (dVar25 = 1.0 / (1.0 - dVar32), dVar25 <= 1000000.0)))) {
                dVar26 = dVar25 * (double)local_a8._0_8_ * dVar28 - dVar26;
                piVar15 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                piVar5 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                dVar25 = local_d0;
                if (piVar15 != piVar5) {
                  do {
                    iVar1 = *piVar15;
                    dVar9 = this->vals[iVar1] * (double)local_88._0_8_;
                    dVar8 = dVar9 + 1e-14;
                    lVar21 = (long)dVar8;
                    dVar8 = (double)(long)(lVar21 - (ulong)(dVar8 < (double)lVar21));
                    dVar9 = (dVar9 - dVar8) - dVar32;
                    if (dVar9 <= 0.0) {
                      dVar9 = 0.0;
                    }
                    dVar9 = dVar9 + dVar8;
                    dVar8 = (this->solval).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[iVar1];
                    if (((dVar9 <= 0.0) || (this->feastol < dVar8)) &&
                       ((0.0 <= dVar9 ||
                        (dVar8 < (this->upper).super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start[iVar1] - this->feastol))))
                    {
                      dVar25 = dVar25 + dVar9 * dVar9;
                    }
                    dVar26 = dVar26 + dVar9 * dVar8;
                    piVar15 = piVar15 + 1;
                  } while (piVar15 != piVar5);
                }
                if (dVar25 < 0.0) {
                  local_78 = dVar26;
                  dVar25 = sqrt(dVar25);
                  dVar26 = local_78;
                }
                else {
                  dVar25 = SQRT(dVar25);
                }
                dVar32 = dVar26 / dVar25;
                if (minEfficacy < dVar26 / dVar25) goto LAB_0027eb5b;
              }
              flipComplementation(this,iVar19);
              dVar32 = minEfficacy;
            }
LAB_0027eb5b:
            piVar14 = piVar14 + 1;
            minEfficacy = dVar32;
          } while (piVar14 != piVar4);
        }
        local_58.lo = 0.0;
        local_98.hi = 1.0;
        local_98.lo = 0.0;
        local_58.hi = dVar31;
        HighsCDouble::operator/=(&local_98,&local_58);
        dVar28 = local_98.lo;
        local_68.hi = local_98.hi;
        local_68.lo = local_98.lo;
        HVar35 = HighsCDouble::operator*(&this->rhs,local_98.hi);
        dVar28 = dVar28 * (this->rhs).hi;
        dVar26 = HVar35.hi + dVar28;
        dVar32 = (HVar35.hi - (dVar26 - dVar28)) + (dVar28 - (dVar26 - (dVar26 - dVar28))) +
                 HVar35.lo;
        dVar28 = floor(dVar26 + dVar32);
        uVar17 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc) ^ DAT_003be0d0._8_8_;
        local_78 = dVar26 - dVar28;
        dVar32 = ((double)((ulong)dVar28 ^ (ulong)DAT_003be0d0) - (local_78 - dVar26)) +
                 (dVar26 - (local_78 - (local_78 - dVar26))) + dVar32;
        dVar26 = (double)((ulong)DAT_003be0d0 ^ (ulong)local_78);
        local_58.hi = 1.0 - local_78;
        uStack_70 = 0;
        local_48._8_4_ = DAT_003be0d0._8_4_;
        local_48._0_8_ = dVar26;
        local_48._12_4_ = DAT_003be0d0._12_4_;
        local_88._8_4_ = (int)uVar17;
        local_88._0_8_ = dVar32;
        local_88._12_4_ = (int)(uVar17 >> 0x20);
        local_58.lo = ((1.0 - (local_78 + local_58.hi)) +
                      (dVar26 - (local_58.hi - (local_78 + local_58.hi)))) - dVar32;
        local_98.hi = 1.0;
        local_98.lo = 0.0;
        HighsCDouble::operator/=(&local_98,&local_58);
        (this->rhs).hi = dVar28 * dVar31;
        (this->rhs).lo = 0.0;
        this->integralSupport = true;
        this->integralCoefficients = false;
        if (this->rowlen != 0) {
          dVar28 = local_78 + (double)local_88._0_8_;
          pdVar16 = this->vals;
          uVar17 = 0;
          do {
            dVar32 = pdVar16[uVar17];
            if ((dVar32 != 0.0) || (NAN(dVar32))) {
              if ((this->isintegral).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar17] == '\0') {
                if (dVar32 <= 0.0) {
                  HVar35 = HighsCDouble::operator*(&local_98,dVar32);
                  pdVar16 = this->vals;
                  pdVar16[uVar17] = HVar35.lo + HVar35.hi;
                  this->integralSupport = false;
                }
                else {
                  pdVar16[uVar17] = 0.0;
                }
              }
              else {
                HVar35 = HighsCDouble::operator*(&local_68,dVar32);
                dVar32 = HVar35.hi;
                dVar26 = dVar32 + 1e-14;
                dVar26 = floor((1e-14 - (dVar26 - dVar32)) + (dVar32 - (dVar26 - (dVar26 - dVar32)))
                               + HVar35.lo + dVar26);
                dVar25 = dVar32 - dVar26;
                dVar32 = (-dVar26 - (dVar25 - dVar32)) + (dVar32 - (dVar25 - (dVar25 - dVar32))) +
                         HVar35.lo;
                local_58.lo = 0.0;
                local_58.hi = dVar26;
                if (dVar28 < dVar25 + dVar32) {
                  dVar9 = dVar25 - local_78;
                  local_58.hi = dVar26 + dVar9;
                  local_58.lo = (dVar26 - (local_58.hi - dVar9)) +
                                (dVar9 - (local_58.hi - (local_58.hi - dVar9))) + 0.0 +
                                ((dVar32 + ((double)local_48._0_8_ - (dVar9 - dVar25)) +
                                           (dVar25 - (dVar9 - (dVar9 - dVar25)))) -
                                (double)local_88._0_8_);
                }
                HVar35 = HighsCDouble::operator*(&local_58,dVar31);
                pdVar16 = this->vals;
                pdVar16[uVar17] = HVar35.lo + HVar35.hi;
              }
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 != (uint)this->rowlen);
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool HighsCutGeneration::cmirCutGenerationHeuristic(double minEfficacy,
                                                    bool onlyInitialCMIRScale) {
  using std::abs;
  using std::floor;
  using std::max;
  using std::sqrt;

  // initialize indicators
  integralSupport = false;
  integralCoefficients = false;

  double continuouscontribution = 0.0;
  double continuoussqrnorm = 0.0;

  deltas.clear();
  deltas.reserve(rowlen + 3);
  integerinds.clear();
  integerinds.reserve(rowlen);

  double maxabsdelta = 0.0;
  constexpr double maxCMirScale = 1e6;
  constexpr double f0min = 0.005;
  constexpr double f0max = 0.995;

  complementation.resize(rowlen);

  for (HighsInt i = 0; i != rowlen; ++i) {
    if (isintegral[i]) {
      integerinds.push_back(i);

      if (upper[i] < 2 * solval[i]) flipComplementation(i);

      if (onlyInitialCMIRScale) continue;

      if (solval[i] > feastol) {
        double delta = abs(vals[i]);
        if (delta <= 1e-4 || delta == maxabsdelta) continue;
        maxabsdelta = max(maxabsdelta, delta);
        deltas.push_back(delta);
      }
    } else {
      updateViolationAndNorm(i, vals[i], continuouscontribution,
                             continuoussqrnorm);
    }
  }

  if (continuoussqrnorm == 0 && deltas.size() > 1) {
    double intScale = HighsIntegers::integralScale(deltas, feastol, kHighsTiny);

    if (intScale != 0.0 && intScale <= 1e4) {
      double scalrhs = double(rhs) * intScale;
      double downrhs = fast_floor(scalrhs);

      double f0 = scalrhs - downrhs;
      if (f0 >= f0min && f0 <= f0max) deltas.push_back(1.0 / intScale);
    }
  }

  deltas.push_back(std::min(1.0, initialScale));
  if (!onlyInitialCMIRScale)
    deltas.push_back(maxabsdelta + std::min(1.0, initialScale));

  if (deltas.empty()) return false;

  pdqsort(deltas.begin(), deltas.end());
  double curdelta = deltas[0];
  for (size_t i = 1; i < deltas.size(); ++i) {
    if (deltas[i] - curdelta <= 10 * feastol)
      deltas[i] = 0.0;
    else
      curdelta = deltas[i];
  }

  deltas.erase(std::remove(deltas.begin(), deltas.end(), 0.0), deltas.end());
  double bestdelta = -1;
  double bestefficacy = minEfficacy;

  for (double delta : deltas) {
    double scale = 1.0 / delta;
    double scalrhs = double(rhs) * scale;
    double downrhs = fast_floor(scalrhs);

    double f0 = scalrhs - downrhs;
    if (f0 < f0min || f0 > f0max) continue;
    double oneoveroneminusf0 = 1.0 / (1.0 - f0);
    if (oneoveroneminusf0 > maxCMirScale) continue;

    double sqrnorm = scale * scale * continuoussqrnorm;
    double viol = scale * continuouscontribution * oneoveroneminusf0 - downrhs;

    for (HighsInt j : integerinds) {
      double scalaj = vals[j] * scale;
      double downaj = fast_floor(scalaj + kHighsTiny);
      double fj = scalaj - downaj;
      double aj = downaj + std::max(0.0, fj - f0);
      updateViolationAndNorm(j, aj, viol, sqrnorm);
    }

    double efficacy = viol / sqrt(sqrnorm);
    if (efficacy > bestefficacy) {
      bestdelta = delta;
      bestefficacy = efficacy;
    }
  }

  if (bestdelta == -1) return false;

  /* try if multiplying best delta by 2 4 or 8 gives a better efficacy */
  for (HighsInt k = 1; !onlyInitialCMIRScale && k <= 3; ++k) {
    double delta = bestdelta * (1 << k);
    double scale = 1.0 / delta;
    double scalrhs = double(rhs) * scale;
    double downrhs = fast_floor(scalrhs);
    double f0 = scalrhs - downrhs;
    if (f0 < f0min || f0 > f0max) continue;

    double oneoveroneminusf0 = 1.0 / (1.0 - f0);
    if (oneoveroneminusf0 > maxCMirScale) continue;

    double sqrnorm = scale * scale * continuoussqrnorm;
    double viol = scale * continuouscontribution * oneoveroneminusf0 - downrhs;

    for (HighsInt j : integerinds) {
      double scalaj = vals[j] * scale;
      double downaj = fast_floor(scalaj + kHighsTiny);
      double fj = scalaj - downaj;
      double aj = downaj + std::max(0.0, fj - f0);
      updateViolationAndNorm(j, aj, viol, sqrnorm);
    }

    double efficacy = viol / sqrt(sqrnorm);
    if (efficacy > bestefficacy) {
      bestdelta = delta;
      bestefficacy = efficacy;
    }
  }

  assert(bestdelta != -1);

  // try to flip complementation of integers to increase efficacy
  for (HighsInt k : integerinds) {
    if (upper[k] == kHighsInf) continue;
    if (solval[k] <= feastol) continue;

    flipComplementation(k);

    double delta = bestdelta;
    double scale = 1.0 / delta;
    double scalrhs = double(rhs) * scale;
    double downrhs = fast_floor(scalrhs);

    double f0 = scalrhs - downrhs;
    if (f0 < f0min || f0 > f0max) {
      flipComplementation(k);
      continue;
    }

    double oneoveroneminusf0 = 1.0 / (1.0 - f0);
    if (oneoveroneminusf0 > maxCMirScale) {
      flipComplementation(k);
      continue;
    }

    double sqrnorm = scale * scale * continuoussqrnorm;
    double viol = scale * continuouscontribution * oneoveroneminusf0 - downrhs;

    for (HighsInt j : integerinds) {
      double scalaj = vals[j] * scale;
      double downaj = fast_floor(scalaj + kHighsTiny);
      double fj = scalaj - downaj;
      double aj = downaj + std::max(0.0, fj - f0);
      updateViolationAndNorm(j, aj, viol, sqrnorm);
    }

    double efficacy = viol / sqrt(sqrnorm);
    if (efficacy > bestefficacy) {
      bestefficacy = efficacy;
    } else {
      flipComplementation(k);
    }
  }

  HighsCDouble scale = 1.0 / HighsCDouble(bestdelta);
  HighsCDouble scalrhs = rhs * scale;
  double downrhs = floor(double(scalrhs));

  HighsCDouble f0 = scalrhs - downrhs;
  HighsCDouble oneoveroneminusf0 = 1.0 / (1.0 - f0);

  rhs = downrhs * bestdelta;
  integralSupport = true;
  integralCoefficients = false;
  for (HighsInt j = 0; j != rowlen; ++j) {
    if (vals[j] == 0.0) continue;
    if (!isintegral[j]) {
      if (vals[j] > 0.0)
        vals[j] = 0.0;
      else {
        vals[j] = double(vals[j] * oneoveroneminusf0);
        integralSupport = false;
      }
    } else {
      HighsCDouble scalaj = scale * vals[j];
      double downaj = floor(double(scalaj + kHighsTiny));
      HighsCDouble fj = scalaj - downaj;
      HighsCDouble aj = downaj;
      if (fj > f0) aj += fj - f0;

      vals[j] = double(aj * bestdelta);
    }
  }

  return true;
}